

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vec3 reflected;
  vec3 local_68;
  vec3 local_48;
  
  local_68.e[2] = (r_in->dir).e[2];
  local_68.e[0] = (r_in->dir).e[0];
  dVar1 = (r_in->dir).e[1];
  local_68.e[1] =
       1.0 / SQRT(local_68.e[2] * local_68.e[2] + local_68.e[0] * local_68.e[0] + dVar1 * dVar1);
  local_68.e[2] = local_68.e[2] * local_68.e[1];
  local_68.e[0] = local_68.e[1] * local_68.e[0];
  local_68.e[1] = local_68.e[1] * dVar1;
  reflect(&local_48,&local_68,&rec->normal);
  dVar1 = this->fuzz;
  random_in_sphere();
  dVar2 = r_in->tm;
  dVar3 = (rec->p).e[0];
  dVar4 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar3;
  (scattered->orig).e[1] = dVar4;
  (scattered->dir).e[0] = dVar1 * local_68.e[0] + local_48.e[0];
  (scattered->dir).e[1] = dVar1 * local_68.e[1] + local_48.e[1];
  (scattered->dir).e[2] = local_68.e[2] * dVar1 + local_48.e[2];
  scattered->tm = dVar2;
  attenuation->e[2] = (this->albedo).e[2];
  dVar1 = (this->albedo).e[1];
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = dVar1;
  return 0.0 < (scattered->dir).e[2] * (rec->normal).e[2] +
               (scattered->dir).e[0] * (rec->normal).e[0] +
               (scattered->dir).e[1] * (rec->normal).e[1];
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered
    ) const {
        vec3 reflected = reflect(unit_vector(r_in.direction()), rec.normal);
        scattered = ray(rec.p, reflected + fuzz * random_in_sphere(), r_in.time());
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }